

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

void binbuf_gettext(_binbuf *x,char **bufp,int *lengthp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *old;
  size_t sVar4;
  char *pcVar5;
  size_t oldsize;
  t_atom *a;
  int iVar6;
  char string [1000];
  char local_418 [1000];
  
  old = (char *)getbytes(0);
  iVar6 = x->b_n;
  if (iVar6 == 0) {
    iVar2 = 0;
  }
  else {
    a = x->b_vec;
    iVar2 = 0;
    do {
      iVar6 = iVar6 + -1;
      if (a->a_type == A_SEMI) {
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
LAB_00168f16:
          if (old[(long)iVar2 + -1] == ' ') {
            iVar2 = iVar2 + -1;
          }
        }
      }
      else if ((a->a_type == A_COMMA) && (iVar2 != 0)) goto LAB_00168f16;
      atom_string(a,local_418,1000);
      sVar4 = strlen(local_418);
      iVar3 = (int)sVar4 + iVar2 + 1;
      pcVar5 = (char *)resizebytes(old,(long)iVar2,(long)iVar3);
      if (pcVar5 != (char *)0x0) {
        strcpy(pcVar5 + iVar2,local_418);
        cVar1 = '\n';
        if (a->a_type != A_SEMI) {
          cVar1 = ' ';
        }
        pcVar5[iVar2 + (int)sVar4] = cVar1;
        old = pcVar5;
        iVar2 = iVar3;
      }
    } while ((pcVar5 != (char *)0x0) && (a = a + 1, iVar6 != 0));
  }
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    oldsize = (size_t)iVar2;
    if (old[oldsize - 1] == ' ') {
      pcVar5 = (char *)resizebytes(old,oldsize,oldsize - 1);
      if (pcVar5 != (char *)0x0) {
        old = pcVar5;
        iVar2 = (int)(oldsize - 1);
      }
    }
  }
  *bufp = old;
  *lengthp = iVar2;
  return;
}

Assistant:

void binbuf_gettext(const t_binbuf *x, char **bufp, int *lengthp)
{
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[MAXPDSTRING];
    const t_atom *ap;
    int indx;

    for (ap = x->b_vec, indx = x->b_n; indx--; ap++)
    {
        int newlength;
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ') length--;
        atom_string(ap, string, MAXPDSTRING);
        newlength = length + (int)strlen(string) + 1;
        if (!(newbuf = resizebytes(buf, length, newlength))) break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI) buf[length-1] = '\n';
        else buf[length-1] = ' ';
    }
    if (length && buf[length-1] == ' ')
    {
        if ((newbuf = t_resizebytes(buf, length, length-1)))
        {
            buf = newbuf;
            length--;
        }
    }
    *bufp = buf;
    *lengthp = length;
}